

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O2

void __thiscall CCIT<TTA>::PerformLabeling(CCIT<TTA> *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  char cVar10;
  int iVar11;
  Mat1i *pMVar12;
  Mat1b *pMVar13;
  uint *puVar14;
  uint *puVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  undefined4 uVar32;
  ulong in_R10;
  ulong uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  bool bVar41;
  uint local_168;
  long local_e8;
  long local_e0;
  long local_d8;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  uVar9 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar9;
  local_98.width = (int)((ulong)uVar9 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar12 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar11 = *(int *)&pMVar12->field_0xc;
  lVar40 = (long)iVar11;
  iVar36 = *(int *)&pMVar12->field_0x8;
  lVar20 = (long)iVar36;
  uVar9 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar9 >> 0x20) + 1) / 2) * (((int)uVar9 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar19 = *(long *)&pMVar13->field_0x10;
  lVar22 = **(long **)&pMVar13->field_0x48;
  lVar34 = lVar19 + lVar22;
  lVar35 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  for (iVar39 = 0; iVar39 < iVar11; iVar39 = iVar39 + (int)lVar26 + 2) {
    lVar37 = (long)iVar39;
    if (*(char *)(lVar19 + lVar37) == '\0') {
      lVar21 = lVar37 + 1;
      iVar23 = (int)lVar21;
      if ((iVar11 <= iVar23) || (*(char *)(lVar19 + lVar21) == '\0')) {
        if (1 < iVar36) {
          if (*(char *)(lVar34 + lVar37) == '\0') {
            if ((iVar23 < iVar11) && (*(char *)(lVar34 + lVar21) != '\0')) goto LAB_001c10d8;
          }
          else {
            uVar16 = TTA::NewLabel();
            in_R10 = (ulong)uVar16;
            *(uint *)(lVar35 + lVar37 * 4) = uVar16;
            if ((iVar23 < iVar11) && (bVar41 = true, *(char *)(lVar34 + lVar21) != '\0'))
            goto LAB_001c1137;
          }
        }
        goto LAB_001c1135;
      }
LAB_001c10d8:
      uVar16 = TTA::NewLabel();
      in_R10 = (ulong)uVar16;
      *(uint *)(lVar35 + lVar37 * 4) = uVar16;
      bVar41 = true;
    }
    else {
      uVar16 = TTA::NewLabel();
      in_R10 = (ulong)uVar16;
      *(uint *)(lVar35 + lVar37 * 4) = uVar16;
      lVar21 = lVar37 + 1;
      if ((iVar11 <= (int)lVar21) ||
         ((bVar41 = true, *(char *)(lVar19 + lVar21) == '\0' &&
          ((iVar36 < 2 || (*(char *)(lVar34 + lVar21) == '\0')))))) {
LAB_001c1135:
        bVar41 = false;
      }
    }
LAB_001c1137:
    lVar21 = lVar19 + 3 + lVar37;
    lVar2 = lVar19 + 3 + lVar22 + lVar37;
    lVar24 = lVar35 + 8 + lVar37 * 4;
    for (lVar26 = 0; (bVar41 && (lVar26 + 2 + lVar37 < lVar40)); lVar26 = lVar26 + 2) {
      lVar30 = lVar37 + 3 + lVar26;
      uVar32 = (undefined4)in_R10;
      if (*(char *)(lVar21 + -1 + lVar26) == '\0') {
        if ((lVar30 < lVar40) && (*(char *)(lVar21 + lVar26) != '\0')) {
          if ((iVar36 < 2) || (*(char *)(lVar2 + -1 + lVar26) == '\0')) {
LAB_001c11e4:
            uVar16 = TTA::NewLabel();
            in_R10 = (ulong)uVar16;
            *(uint *)(lVar24 + lVar26 * 4) = uVar16;
          }
          else {
            *(undefined4 *)(lVar24 + lVar26 * 4) = uVar32;
          }
          bVar41 = true;
          goto LAB_001c11f6;
        }
        if (1 < iVar36) {
          if (*(char *)(lVar2 + -1 + lVar26) == '\0') {
            if ((lVar30 < lVar40) && (*(char *)(lVar2 + lVar26) != '\0')) goto LAB_001c11e4;
          }
          else {
            *(undefined4 *)(lVar24 + lVar26 * 4) = uVar32;
            if (lVar30 < lVar40) goto LAB_001c11d1;
          }
        }
LAB_001c11f4:
        bVar41 = false;
      }
      else {
        *(undefined4 *)(lVar24 + lVar26 * 4) = uVar32;
        if (lVar40 <= lVar30) goto LAB_001c11f4;
        bVar41 = true;
        if (*(char *)(lVar21 + lVar26) == '\0') {
          if (1 < iVar36) {
LAB_001c11d1:
            bVar41 = true;
            if (*(char *)(lVar2 + lVar26) != '\0') goto LAB_001c11f6;
          }
          goto LAB_001c11f4;
        }
      }
LAB_001c11f6:
    }
  }
  local_d8 = 1;
  local_e0 = 3;
  local_e8 = 0;
  for (uVar29 = 2; (long)uVar29 < lVar20; uVar29 = uVar29 + 2) {
    pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar12 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar35 = *(long *)&pMVar13->field_0x10;
    lVar37 = **(long **)&pMVar13->field_0x48;
    lVar19 = lVar35 + lVar37 * uVar29;
    lVar30 = lVar19 - lVar37;
    lVar26 = lVar19 + lVar37;
    lVar21 = *(long *)&pMVar12->field_0x10;
    lVar2 = **(long **)&pMVar12->field_0x48;
    lVar22 = lVar21 + lVar2 * uVar29;
    lVar24 = lVar22 + lVar2 * -2;
    lVar31 = lVar30 + -1;
    lVar34 = lVar24 + -8;
    uVar33 = uVar29 | 1;
    uVar27 = 0;
    while (iVar36 = (int)uVar27, iVar36 < iVar11) {
      lVar25 = (long)iVar36;
      uVar1 = lVar25 + 1;
      iVar39 = (int)uVar1;
      if (*(char *)(lVar19 + lVar25) == '\0') {
        if ((iVar39 < iVar11) && (*(char *)(lVar19 + uVar1) != '\0')) {
          if (*(char *)(lVar30 + uVar1) == '\0') {
            if (*(char *)(lVar30 + lVar25) != '\0') {
              uVar16 = *(uint *)(lVar24 + lVar25 * 4);
              in_R10 = (ulong)uVar16;
              *(uint *)(lVar22 + lVar25 * 4) = uVar16;
              goto LAB_001c1567;
            }
LAB_001c15dd:
            if (((int)(lVar25 + 2) < iVar11) && (*(char *)(lVar30 + lVar25 + 2) != '\0')) {
              in_R10 = (ulong)*(uint *)(lVar24 + 8 + lVar25 * 4);
            }
            else {
LAB_001c15f8:
              uVar16 = TTA::NewLabel();
              in_R10 = (ulong)uVar16;
            }
          }
          else {
            in_R10 = (ulong)*(uint *)(lVar24 + lVar25 * 4);
          }
          *(int *)(lVar22 + lVar25 * 4) = (int)in_R10;
          bVar41 = true;
        }
        else {
          if ((long)uVar33 < lVar20) {
            if (*(char *)(lVar26 + lVar25) == '\0') {
              if ((iVar39 < iVar11) && (*(char *)(lVar26 + uVar1) != '\0')) goto LAB_001c15f8;
            }
            else {
              uVar16 = TTA::NewLabel();
              in_R10 = (ulong)uVar16;
              *(uint *)(lVar22 + lVar25 * 4) = uVar16;
              if ((iVar39 < iVar11) && (bVar41 = true, *(char *)(lVar26 + uVar1) != '\0'))
              goto LAB_001c160c;
            }
          }
LAB_001c153c:
          bVar41 = false;
        }
      }
      else if ((iVar39 < iVar11) && (*(char *)(lVar19 + uVar1) != '\0')) {
        if (*(char *)(lVar30 + lVar25) == '\0') {
          if (*(char *)(lVar30 + uVar1) == '\0') {
            if ((iVar36 < 2) || (*(char *)(lVar31 + uVar27) == '\0')) goto LAB_001c15dd;
            uVar16 = *(uint *)(lVar34 + uVar27 * 4);
            in_R10 = (ulong)uVar16;
            *(uint *)(lVar22 + lVar25 * 4) = uVar16;
            bVar41 = true;
            if (((int)(uVar27 + 2) < iVar11) && (*(char *)(lVar30 + uVar27 + 2) != '\0')) {
              uVar16 = *(uint *)(lVar24 + 8 + uVar27 * 4);
              goto LAB_001c1588;
            }
          }
          else {
            uVar16 = *(uint *)(lVar24 + lVar25 * 4);
            in_R10 = (ulong)uVar16;
            *(uint *)(lVar22 + lVar25 * 4) = uVar16;
            bVar41 = true;
            if ((1 < iVar36) && (*(char *)(lVar31 + uVar27) != '\0')) {
              uVar16 = *(uint *)(lVar34 + uVar27 * 4);
LAB_001c1588:
              bVar41 = true;
              TTA::Merge((uint)in_R10,uVar16);
            }
          }
        }
        else {
          uVar16 = *(uint *)(lVar24 + lVar25 * 4);
          in_R10 = (ulong)uVar16;
          *(uint *)(lVar22 + lVar25 * 4) = uVar16;
          bVar41 = true;
          if (*(char *)(lVar30 + uVar1) == '\0') {
LAB_001c1567:
            bVar41 = true;
            if (((int)(lVar25 + 2) < iVar11) && (*(char *)(lVar30 + lVar25 + 2) != '\0')) {
              uVar16 = *(uint *)(lVar24 + 8 + lVar25 * 4);
              goto LAB_001c1588;
            }
          }
        }
      }
      else {
        if (*(char *)(lVar30 + lVar25) == '\0') {
          if ((iVar36 < 2) || (*(char *)(lVar31 + uVar27) == '\0')) {
            if ((iVar39 < iVar11) && (*(char *)(lVar30 + uVar1) != '\0')) goto LAB_001c13b4;
            uVar16 = TTA::NewLabel();
            goto LAB_001c14ac;
          }
          uVar16 = *(uint *)(lVar34 + uVar27 * 4);
          in_R10 = (ulong)uVar16;
          *(uint *)(lVar22 + lVar25 * 4) = uVar16;
          if (iVar11 <= iVar39) goto LAB_001c153c;
          if (*(char *)(lVar30 + (uVar1 & 0xffffffff)) != '\0') {
            TTA::Merge(uVar16,*(uint *)(lVar24 + lVar25 * 4));
          }
        }
        else {
LAB_001c13b4:
          uVar16 = *(uint *)(lVar24 + lVar25 * 4);
LAB_001c14ac:
          in_R10 = (ulong)uVar16;
          *(uint *)(lVar22 + lVar25 * 4) = uVar16;
        }
        bVar41 = false;
        if ((iVar39 < iVar11) && ((long)uVar33 < lVar20)) {
          bVar41 = *(char *)(lVar26 + uVar1) != '\0';
        }
      }
LAB_001c160c:
      lVar3 = lVar37 * local_d8 + lVar35 + 4 + lVar25;
      lVar4 = lVar21 + lVar2 * local_e8 + 0x10 + lVar25 * 4;
      lVar18 = lVar37 * local_e0 + lVar35 + 3 + lVar25;
      lVar5 = lVar35 + lVar37 * uVar29 + 3 + lVar25;
      lVar6 = lVar21 + lVar2 * uVar29 + 8 + lVar25 * 4;
      for (lVar38 = 0; (uVar16 = (uint)in_R10, bVar41 && (lVar25 + lVar38 + 2 < lVar40));
          lVar38 = lVar38 + 2) {
        lVar8 = lVar25 + 3 + lVar38;
        if (*(char *)(lVar5 + -1 + lVar38) == '\0') {
          if ((lVar8 < lVar40) && (*(char *)(lVar5 + lVar38) != '\0')) {
            if (((long)uVar33 < lVar20) && (*(char *)(lVar18 + -1 + lVar38) != '\0')) {
              *(uint *)(lVar6 + lVar38 * 4) = uVar16;
              if (*(char *)(lVar3 + -1 + lVar38) == '\0') {
                if (*(char *)(lVar3 + -2 + lVar38) != '\0') {
                  if ((lVar25 + lVar38 + 4 < lVar40) && (*(char *)(lVar3 + lVar38) != '\0')) {
                    uVar17 = TTA::Merge(*(uint *)(lVar4 + -8 + lVar38 * 4),
                                        *(uint *)(lVar4 + lVar38 * 4));
                  }
                  else {
                    uVar17 = *(uint *)(lVar4 + -8 + lVar38 * 4);
                  }
                  goto LAB_001c1a10;
                }
              }
              else {
                uVar17 = *(uint *)(lVar4 + -8 + lVar38 * 4);
LAB_001c1a10:
                TTA::Merge(uVar16,uVar17);
              }
              if ((lVar25 + lVar38 + 4 < lVar40) && (*(char *)(lVar3 + lVar38) != '\0')) {
                uVar17 = *(uint *)(lVar4 + lVar38 * 4);
                goto LAB_001c1a3b;
              }
              goto LAB_001c1a40;
            }
            if (*(char *)(lVar3 + -1 + lVar38) == '\0') {
              if (*(char *)(lVar3 + -2 + lVar38) != '\0') {
                uVar16 = *(uint *)(lVar4 + -8 + lVar38 * 4);
                in_R10 = (ulong)uVar16;
                *(uint *)(lVar6 + lVar38 * 4) = uVar16;
                bVar41 = true;
                if ((lVar25 + lVar38 + 4 < lVar40) && (*(char *)(lVar3 + lVar38) != '\0')) {
                  TTA::Merge(uVar16,*(uint *)(lVar4 + lVar38 * 4));
                  in_R10 = (ulong)uVar16;
                }
                goto LAB_001c19eb;
              }
              if ((lVar40 <= lVar25 + lVar38 + 4) || (*(char *)(lVar3 + lVar38) == '\0'))
              goto LAB_001c19d7;
              in_R10 = (ulong)*(uint *)(lVar4 + lVar38 * 4);
            }
            else {
              in_R10 = (ulong)*(uint *)(lVar4 + -8 + lVar38 * 4);
            }
LAB_001c19df:
            *(int *)(lVar6 + lVar38 * 4) = (int)in_R10;
LAB_001c19e8:
            bVar41 = true;
            goto LAB_001c19eb;
          }
          if ((long)uVar33 < lVar20) {
            if (*(char *)(lVar18 + -1 + lVar38) != '\0') {
              *(uint *)(lVar6 + lVar38 * 4) = uVar16;
              if (lVar40 <= lVar8) goto LAB_001c18a9;
              goto LAB_001c1726;
            }
            if ((lVar8 < lVar40) && (*(char *)(lVar18 + lVar38) != '\0')) {
LAB_001c19d7:
              uVar16 = TTA::NewLabel();
              in_R10 = (ulong)uVar16;
              goto LAB_001c19df;
            }
          }
LAB_001c18a9:
          bVar41 = false;
        }
        else {
          lVar7 = lVar25 + lVar38;
          *(uint *)(lVar6 + lVar38 * 4) = uVar16;
          if ((lVar40 <= lVar8) || (*(char *)(lVar5 + lVar38) == '\0')) {
            if (*(char *)(lVar3 + -2 + lVar38) == '\0') {
              if ((-1 < lVar7) && (*(char *)(lVar3 + -3 + lVar38) != '\0')) {
                if ((lVar8 < lVar40) && (*(char *)(lVar3 + -1 + lVar38) != '\0')) {
                  uVar16 = TTA::Merge(*(uint *)(lVar4 + -0x10 + lVar38 * 4),
                                      *(uint *)(lVar4 + -8 + lVar38 * 4));
                  in_R10 = in_R10 & 0xffffffff;
                }
                else {
                  uVar16 = *(uint *)(lVar4 + -0x10 + lVar38 * 4);
                }
                goto LAB_001c16fa;
              }
              if (lVar40 <= lVar8) goto LAB_001c18a9;
              if (*(char *)(lVar3 + -1 + lVar38) != '\0') goto LAB_001c16f1;
            }
            else {
LAB_001c16f1:
              uVar16 = *(uint *)(lVar4 + -8 + lVar38 * 4);
LAB_001c16fa:
              uVar17 = (uint)in_R10;
              in_R10 = in_R10 & 0xffffffff;
              TTA::Merge(uVar17,uVar16);
            }
            if ((lVar8 < lVar40) && ((long)uVar33 < lVar20)) {
LAB_001c1726:
              bVar41 = true;
              if (*(char *)(lVar18 + lVar38) != '\0') goto LAB_001c19eb;
            }
            goto LAB_001c18a9;
          }
          cVar10 = *(char *)(lVar3 + -1 + lVar38);
          if (*(char *)(lVar3 + -2 + lVar38) != '\0') {
            if (((cVar10 == '\0') && (lVar25 + lVar38 + 4 < lVar40)) &&
               (*(char *)(lVar3 + lVar38) != '\0')) {
              uVar17 = *(uint *)(lVar4 + -8 + lVar38 * 4);
LAB_001c16dc:
              uVar28 = *(uint *)(lVar4 + lVar38 * 4);
LAB_001c1869:
              uVar17 = TTA::Merge(uVar17,uVar28);
            }
            else {
LAB_001c1878:
              uVar17 = *(uint *)(lVar4 + -8 + lVar38 * 4);
            }
LAB_001c1887:
            in_R10 = in_R10 & 0xffffffff;
            TTA::Merge(uVar16,uVar17);
            goto LAB_001c19e8;
          }
          if (cVar10 != '\0') {
            if ((lVar7 < 0) || (*(char *)(lVar3 + -3 + lVar38) == '\0')) goto LAB_001c1878;
            uVar17 = *(uint *)(lVar4 + -0x10 + lVar38 * 4);
            uVar28 = *(uint *)(lVar4 + -8 + lVar38 * 4);
            goto LAB_001c1869;
          }
          if ((-1 < lVar7) && (*(char *)(lVar3 + -3 + lVar38) != '\0')) {
            if ((lVar25 + lVar38 + 4 < lVar40) && (*(char *)(lVar3 + lVar38) != '\0')) {
              uVar17 = *(uint *)(lVar4 + -0x10 + lVar38 * 4);
              goto LAB_001c16dc;
            }
            uVar17 = *(uint *)(lVar4 + -0x10 + lVar38 * 4);
            goto LAB_001c1887;
          }
          bVar41 = true;
          if ((lVar40 <= lVar25 + lVar38 + 4) || (*(char *)(lVar3 + lVar38) == '\0'))
          goto LAB_001c19eb;
          uVar17 = *(uint *)(lVar4 + lVar38 * 4);
LAB_001c1a3b:
          TTA::Merge(uVar16,uVar17);
LAB_001c1a40:
          bVar41 = true;
          in_R10 = in_R10 & 0xffffffff;
        }
LAB_001c19eb:
      }
      uVar27 = (ulong)(iVar36 + (int)lVar38 + 2);
    }
    local_d8 = local_d8 + 2;
    local_e8 = local_e8 + 2;
    local_e0 = local_e0 + 2;
  }
  uVar16 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar16;
  puVar14 = TTA::rtable_;
  pMVar13 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar12 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar16 = *(uint *)&pMVar12->field_0x8;
  local_168 = *(uint *)&pMVar12->field_0xc & 0x80000001;
  uVar29 = (long)(int)*(uint *)&pMVar12->field_0xc & 0xfffffffffffffffe;
  lVar34 = 1;
  lVar19 = 0;
  do {
    puVar15 = TTA::rtable_;
    if ((long)((long)(int)uVar16 & 0xfffffffffffffffeU) <= lVar19) {
      if ((uVar16 & 0x80000001) == 1) {
        lVar22 = **(long **)&pMVar13->field_0x48 * lVar19 + *(long *)&pMVar13->field_0x10;
        lVar34 = lVar19 * **(long **)&pMVar12->field_0x48 + *(long *)&pMVar12->field_0x10;
        for (lVar19 = 0; lVar19 < (long)uVar29; lVar19 = lVar19 + 2) {
          lVar35 = (long)*(int *)(lVar34 + lVar19 * 4);
          if (lVar35 < 1) {
            *(undefined8 *)(lVar34 + lVar19 * 4) = 0;
          }
          else {
            uVar16 = puVar15[lVar35];
            uVar17 = uVar16;
            if (*(char *)(lVar22 + lVar19) == '\0') {
              uVar17 = 0;
            }
            *(uint *)(lVar34 + lVar19 * 4) = uVar17;
            if (*(char *)(lVar22 + 1 + lVar19) == '\0') {
              *(undefined4 *)(lVar34 + 4 + lVar19 * 4) = 0;
            }
            else {
              *(uint *)(lVar34 + 4 + lVar19 * 4) = uVar16;
            }
          }
        }
        if (local_168 == 1) {
          lVar35 = (long)*(int *)(lVar34 + lVar19 * 4);
          uVar16 = 0;
          if ((0 < lVar35) && (uVar16 = 0, *(char *)(lVar19 + lVar22) != '\0')) {
            uVar16 = TTA::rtable_[lVar35];
          }
          *(uint *)(lVar34 + lVar19 * 4) = uVar16;
        }
      }
      TTA::Dealloc();
      return;
    }
    lVar22 = **(long **)&pMVar12->field_0x48;
    lVar37 = lVar22 * lVar19 + *(long *)&pMVar12->field_0x10;
    lVar40 = lVar22 * lVar34 + *(long *)&pMVar12->field_0x10;
    lVar20 = **(long **)&pMVar13->field_0x48 * lVar34 + *(long *)&pMVar13->field_0x10;
    lVar35 = **(long **)&pMVar13->field_0x48 * lVar19 + *(long *)&pMVar13->field_0x10;
    for (uVar27 = 0; (long)uVar27 < (long)uVar29; uVar27 = uVar27 + 2) {
      lVar21 = (long)*(int *)(lVar37 + uVar27 * 4);
      if (lVar21 < 1) {
        *(undefined8 *)(lVar37 + uVar27 * 4) = 0;
        uVar33 = uVar27 | 1;
        *(undefined4 *)(lVar40 + uVar27 * 4) = 0;
        uVar17 = 0;
      }
      else {
        uVar17 = puVar15[lVar21];
        uVar28 = uVar17;
        if (*(char *)(lVar35 + uVar27) == '\0') {
          uVar28 = 0;
        }
        *(uint *)(lVar37 + uVar27 * 4) = uVar28;
        uVar28 = uVar17;
        if (*(char *)(lVar35 + 1 + uVar27) == '\0') {
          uVar28 = 0;
        }
        uVar33 = uVar27 + 1;
        *(uint *)(lVar37 + 4 + uVar27 * 4) = uVar28;
        uVar28 = uVar17;
        if (*(char *)(lVar20 + uVar27) == '\0') {
          uVar28 = 0;
        }
        *(uint *)(lVar40 + uVar27 * 4) = uVar28;
        if (*(char *)(lVar20 + 1 + uVar27) == '\0') {
          uVar17 = 0;
        }
      }
      *(uint *)(lVar37 + lVar22 + uVar33 * 4) = uVar17;
    }
    if (local_168 == 1) {
      lVar22 = (long)*(int *)(lVar37 + uVar27 * 4);
      if (lVar22 < 1) {
        *(undefined4 *)(lVar37 + uVar27 * 4) = 0;
      }
      else {
        uVar17 = puVar14[lVar22];
        uVar28 = uVar17;
        if (*(char *)(uVar27 + lVar35) == '\0') {
          uVar28 = 0;
        }
        *(uint *)(lVar37 + uVar27 * 4) = uVar28;
        if (*(char *)(uVar27 + lVar20) != '\0') {
          *(uint *)(lVar40 + uVar27 * 4) = uVar17;
          goto LAB_001c1be3;
        }
      }
      *(undefined4 *)(lVar40 + uVar27 * 4) = 0;
    }
LAB_001c1be3:
    lVar19 = lVar19 + 2;
    lVar34 = lVar34 + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        int w = img_labels_.cols;
        int h = img_labels_.rows;

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        // Second scan (changed with better performing strategy to handle odd rows and columns)
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }